

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerMSL::is_direct_input_builtin(CompilerMSL *this,BuiltIn bi_type)

{
  byte bVar1;
  ExecutionModel EVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  bVar1 = 0;
  if ((int)bi_type < 0xb) {
    if ((int)bi_type < 5) {
      if (bi_type < 2) goto LAB_0027a3f3;
      uVar4 = bi_type - BuiltInClipDistance;
      goto LAB_0027a3ee;
    }
    if (bi_type - BuiltInVertexId < 2) {
LAB_0027a3cf:
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar5 = EVar2 != ExecutionModelVertex;
      bVar1 = (this->msl_options).vertex_for_tessellation;
LAB_0027a3e2:
      bVar1 = bVar1 ^ 1 | bVar5;
      goto LAB_0027a3f3;
    }
    if (bi_type - BuiltInPrimitiveId < 2) {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar5 = EVar2 != ExecutionModelTessellationControl;
      bVar1 = (this->msl_options).multi_patch_workgroup;
      goto LAB_0027a3e2;
    }
  }
  else {
    if (bi_type < (BuiltInSubgroupId|BuiltInCullDistance)) {
      uVar3 = (ulong)bi_type;
      if ((0x885800UL >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0027a3f3;
      if ((0x21000000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0xc0000000000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0027a3cf;
        goto LAB_0027a31e;
      }
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar1 = 1;
      if (EVar2 == ExecutionModelGLCompute) goto LAB_0027a3f3;
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if (EVar2 == ExecutionModelFragment) {
        bVar1 = 0x4ee7 < (this->msl_options).msl_version;
        goto LAB_0027a3f3;
      }
LAB_0027a428:
      bVar1 = 0;
      goto LAB_0027a3f3;
    }
LAB_0027a31e:
    uVar4 = bi_type - BuiltInSubgroupEqMask;
    if (uVar4 < 0x19) {
      if ((0x40001fU >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0027a3f3;
      if ((0x300U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0027a3cf;
      if (uVar4 == 0x18) {
        EVar2 = Compiler::get_execution_model((Compiler *)this);
        if ((EVar2 == ExecutionModelFragment) && ((this->msl_options).multiview == true)) {
          bVar1 = (this->msl_options).multiview_layered_rendering;
          goto LAB_0027a3f3;
        }
        goto LAB_0027a428;
      }
    }
    uVar4 = bi_type - BuiltInBaryCoordNV;
LAB_0027a3ee:
    if (uVar4 < 2) goto LAB_0027a3f3;
  }
  bVar1 = 1;
LAB_0027a3f3:
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompilerMSL::is_direct_input_builtin(BuiltIn bi_type)
{
	switch (bi_type)
	{
	// Vertex function in
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInBaseVertex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
		return get_execution_model() != ExecutionModelVertex || !msl_options.vertex_for_tessellation;
	// Tess. control function in
	case BuiltInPosition:
	case BuiltInPointSize:
	case BuiltInClipDistance:
	case BuiltInCullDistance:
	case BuiltInPatchVertices:
		return false;
	case BuiltInInvocationId:
	case BuiltInPrimitiveId:
		return get_execution_model() != ExecutionModelTessellationControl || !msl_options.multi_patch_workgroup;
	// Tess. evaluation function in
	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		return false;
	// Fragment function in
	case BuiltInSamplePosition:
	case BuiltInHelperInvocation:
	case BuiltInBaryCoordNV:
	case BuiltInBaryCoordNoPerspNV:
		return false;
	case BuiltInViewIndex:
		return get_execution_model() == ExecutionModelFragment && msl_options.multiview &&
		       msl_options.multiview_layered_rendering;
	// Any stage function in
	case BuiltInDeviceIndex:
	case BuiltInSubgroupEqMask:
	case BuiltInSubgroupGeMask:
	case BuiltInSubgroupGtMask:
	case BuiltInSubgroupLeMask:
	case BuiltInSubgroupLtMask:
		return false;
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInSubgroupSize:
		return get_execution_model() == ExecutionModelGLCompute ||
		       (get_execution_model() == ExecutionModelFragment && msl_options.supports_msl_version(2, 2));
	default:
		return true;
	}
}